

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blech32.c
# Opt level: O3

int wally_confidential_addr_to_addr_segwit
              (char *address,char *confidential_addr_family,char *addr_family,char **output)

{
  size_t sVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t bytes_len;
  uint8_t witver;
  uchar buf [1000];
  byte local_421;
  size_t local_420;
  uint8_t local_418 [31];
  uchar local_3f9;
  char local_3f8;
  
  local_420 = 0;
  iVar3 = -2;
  if ((output != (char **)0x0) && (*output = (char *)0x0, address != (char *)0x0)) {
    iVar2 = blech32_addr_decode(&local_421,local_418,&local_420,confidential_addr_family,address);
    sVar1 = local_420;
    iVar3 = -2;
    if ((iVar2 != 0) && ((local_420 == 0x41 || (local_420 == 0x35)))) {
      bytes_len = local_420 - 0x1f;
      sVar4 = value_to_op_n((ulong)local_421);
      local_3f9 = (uchar)sVar4;
      local_3f8 = (char)sVar1 + -0x21;
      iVar3 = wally_addr_segwit_from_bytes(&local_3f9,bytes_len,addr_family,0,output);
    }
    wally_clear(local_418,1000);
  }
  return iVar3;
}

Assistant:

int wally_confidential_addr_to_addr_segwit(
    const char *address,
    const char *confidential_addr_family,
    const char *addr_family,
    char **output)
{
    unsigned char buf[WALLY_BLECH32_MAXLEN];
    unsigned char *hash_bytes_p = &buf[EC_PUBLIC_KEY_LEN - 2];
    size_t written = 0;
    int ret;
    uint8_t witver;

    if (output)
        *output = NULL;

    if (!address || !output)
        return WALLY_EINVAL;

    if (!blech32_addr_decode(&witver, buf, &written, confidential_addr_family, address))
        ret = WALLY_EINVAL;
    else if (written != 53 && written != 65)
        ret = WALLY_EINVAL;
    else {
        written = written - EC_PUBLIC_KEY_LEN + 2;
        hash_bytes_p[0] = value_to_op_n(witver);
        hash_bytes_p[1] = (unsigned char) (written - 2);
        ret = wally_addr_segwit_from_bytes(hash_bytes_p, written,
                                           addr_family, 0, output);
    }

    wally_clear(buf, sizeof(buf));
    return ret;
}